

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O1

void PredictorAdd1_C(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  
  if (0 < num_pixels) {
    uVar1 = out[-1];
    uVar2 = 0;
    do {
      uVar1 = (uVar1 & 0xff00ff) + (in[uVar2] & 0xff00ff) & 0xff00ff |
              (uVar1 & 0xff00ff00) + (in[uVar2] & 0xff00ff00) & 0xff00ff00;
      out[uVar2] = uVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)num_pixels != uVar2);
  }
  return;
}

Assistant:

static void PredictorAdd1_C(const uint32_t* in, const uint32_t* upper,
                            int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  uint32_t left = out[-1];
  (void)upper;
  for (i = 0; i < num_pixels; ++i) {
    out[i] = left = VP8LAddPixels(in[i], left);
  }
}